

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

size_t flatbuffers::InlineSize(Type *type)

{
  size_t sVar1;
  Type local_28;
  
  if (type->base_type == BASE_TYPE_STRUCT) {
    sVar1 = 4;
    if (type->struct_def->fixed == true) {
      sVar1 = type->struct_def->bytesize;
    }
  }
  else {
    switch(type->base_type) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
      sVar1 = 1;
      break;
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
      sVar1 = 2;
      break;
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_UNION:
      sVar1 = 4;
      break;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
    case BASE_TYPE_DOUBLE:
    case BASE_TYPE_VECTOR64:
      sVar1 = 8;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                    ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
    case BASE_TYPE_ARRAY:
      local_28.base_type = type->element;
      local_28.fixed_length = type->fixed_length;
      local_28.element = BASE_TYPE_NONE;
      local_28.struct_def = type->struct_def;
      local_28.enum_def = type->enum_def;
      sVar1 = InlineSize(&local_28);
      sVar1 = type->fixed_length * sVar1;
    }
  }
  return sVar1;
}

Assistant:

inline size_t InlineSize(const Type &type) {
  return IsStruct(type)
             ? type.struct_def->bytesize
             : (IsArray(type)
                    ? InlineSize(type.VectorType()) * type.fixed_length
                    : SizeOf(type.base_type));
}